

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pick.cpp
# Opt level: O1

void __thiscall
polyscope::pick::setSelection(pick *this,pair<polyscope::Structure_*,_unsigned_long> newPick)

{
  if (this != (pick *)0x0) {
    haveSelectionVal = 1;
    currPickStructure = this;
    currLocalPickInd = newPick.first;
    return;
  }
  haveSelectionVal = 0;
  currLocalPickInd = (Structure *)0x0;
  currPickStructure = (pick *)0x0;
  return;
}

Assistant:

void setSelection(std::pair<Structure*, size_t> newPick) {
  if (newPick.first == nullptr) {
    resetSelection();
  } else {
    haveSelectionVal = true;
    currPickStructure = newPick.first;
    currLocalPickInd = newPick.second;
  }
}